

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O3

void __thiscall mir::inst::PtrOffsetInst::display(PtrOffsetInst *this,ostream *o)

{
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::__ostream_insert<char,std::char_traits<char>>(o," = offset ",10);
  (**(this->ptr).super_Displayable._vptr_Displayable)(&this->ptr,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," by ",4);
  (**(this->offset).super_Displayable._vptr_Displayable)(&this->offset,o);
  return;
}

Assistant:

void PtrOffsetInst::display(std::ostream& o) const {
  o << dest << " = offset " << ptr << " by " << offset;
}